

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_status_t linear_hash_get(ion_byte_t *key,ion_byte_t *value,linear_hash_table_t *linear_hash)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  ion_dictionary_compare_t p_Var4;
  bool bVar5;
  undefined8 bucket_loc;
  ion_fpos_t __dest;
  byte bVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  undefined1 *__dest_00;
  ulong uVar12;
  size_t sVar13;
  ion_fpos_t bucket_loc_00;
  undefined1 *__s;
  long lVar14;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  linear_hash_bucket_t bucket;
  
  uStack_a0 = 0x108378;
  iVar9 = insert_hash_to_bucket(key,linear_hash);
  if (iVar9 < linear_hash->next_split) {
    uStack_a0 = 0x10838a;
    iVar9 = hash_to_bucket(key,linear_hash);
  }
  bucket_loc_00 = -1;
  if (iVar9 < linear_hash->bucket_map->current_size) {
    bucket_loc_00 = linear_hash->bucket_map->data[iVar9];
  }
  uStack_a0 = 0x1083b5;
  bVar6 = linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)local_98,linear_hash);
  uVar12 = 0;
  if (bVar6 == 0) {
    uVar10 = 0;
    iVar9 = (linear_hash->super).record.key_size;
    __dest_00 = local_98 + -((long)iVar9 + 0xfU & 0xfffffffffffffff0) +
                -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    sVar13 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = __dest_00 + -(sVar13 + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)(__s + -8) = 0x10841a;
    memset(__s,0,sVar13);
    bVar5 = false;
    lVar14 = 0;
    bucket.overflow_location = (ion_fpos_t)(local_98 + -((long)iVar9 + 0xfU & 0xfffffffffffffff0));
    do {
      pFVar3 = (FILE *)linear_hash->database;
      *(undefined8 *)(__s + -8) = 0x108438;
      fseek(pFVar3,bucket_loc_00 + 0x10,0);
      iVar9 = linear_hash->records_per_bucket;
      sVar13 = linear_hash->record_total_size;
      pFVar3 = (FILE *)linear_hash->database;
      *(undefined8 *)(__s + -8) = 0x10844d;
      fread(__s,sVar13,(long)iVar9,pFVar3);
      bVar8 = 0 < linear_hash->records_per_bucket;
      bVar11 = 1;
      if (0 < linear_hash->records_per_bucket) {
        iVar9 = 0;
        do {
          __dest = bucket.overflow_location;
          iVar1 = (linear_hash->super).record.key_size;
          cVar7 = __s[lVar14];
          *(undefined8 *)(__s + -8) = 0x10849b;
          memcpy((void *)__dest,__s + lVar14 + 1,(long)iVar1);
          iVar2 = (linear_hash->super).record.value_size;
          *(undefined8 *)(__s + -8) = 0x1084b2;
          memcpy(__dest_00,__s + iVar1 + lVar14 + 1,(long)iVar2);
          if (cVar7 != '\0') {
            p_Var4 = (linear_hash->super).compare;
            *(undefined8 *)(__s + -8) = 0x1084c6;
            cVar7 = (*p_Var4)((ion_key_t)__dest,key,iVar1);
            if (cVar7 == '\0') {
              uVar10 = uVar10 + 1;
              iVar9 = (linear_hash->super).record.value_size;
              *(undefined8 *)(__s + -8) = 0x108500;
              memcpy(value,__dest_00,(long)iVar9);
              bVar11 = 0;
              goto LAB_0010850d;
            }
          }
          lVar14 = lVar14 + linear_hash->record_total_size;
          iVar9 = iVar9 + 1;
          bVar8 = iVar9 < linear_hash->records_per_bucket;
        } while (iVar9 < linear_hash->records_per_bucket);
        bVar11 = 1;
      }
LAB_0010850d:
      bucket_loc = bucket._0_8_;
      if (!bVar8) {
        if (bucket._0_8_ == -1) {
          bVar5 = true;
        }
        else {
          *(undefined8 *)(__s + -8) = 0x108532;
          bVar6 = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_98,linear_hash);
          if (bVar6 != 0) goto LAB_00108564;
          lVar14 = 0;
          bucket_loc_00 = bucket_loc;
        }
      }
    } while ((bool)(bVar11 & !bVar5));
    bVar6 = uVar10 == 0;
LAB_00108564:
    uVar12 = (ulong)uVar10 << 0x20;
  }
  return (ion_status_t)(bVar6 | uVar12);
}

Assistant:

ion_status_t
linear_hash_get(
	ion_byte_t			*key,
	ion_byte_t			*value,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int found					= boolean_false;
	int i;

	ion_byte_t *records			= alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_fpos_t		record_loc;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false && found == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.count++;
					memcpy(value, record_value, linear_hash->super.record.value_size);
					found = 1;
					break;
				}
			}

			record_offset	+= linear_hash->record_total_size;
			record_loc		+= linear_hash->record_total_size;
		}

		if (found == boolean_false) {
			if (bucket.overflow_location == linear_hash_end_of_list) {
				terminal = boolean_true;
			}
			else {
				record_offset	= 0;
				bucket_loc		= bucket.overflow_location;
				status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

				if (status.error != err_ok) {
					return status;
				}
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}